

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# at.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  ThreadedSocketAcceptor *this;
  SocketAcceptor *this_00;
  exception *e;
  AcceptorPtr pAcceptor;
  string local_238;
  MessageStoreFactory local_218;
  FileStoreFactory factory;
  undefined1 local_160 [8];
  Application application;
  SessionSettings settings;
  string local_38 [7];
  bool threaded;
  string file;
  char **argv_local;
  int argc_local;
  
  file.field_2._8_8_ = argv;
  std::__cxx11::string::string(local_38);
  iVar1 = getopt(argc,(char **)file.field_2._8_8_,"+f:");
  if (iVar1 == 0x66) {
    std::__cxx11::string::operator=(local_38,optarg);
    iVar1 = getopt(argc,(char **)file.field_2._8_8_,"+t");
    FIX::SessionSettings::SessionSettings
              ((SessionSettings *)
               &application.m_cracker.m_orderIDs._M_t._M_impl.super__Rb_tree_header._M_node_count,
               local_38,false);
    Application::Application((Application *)local_160);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"store",
               (allocator<char> *)
               ((long)&pAcceptor._M_t.
                       super___uniq_ptr_impl<FIX::Acceptor,_std::default_delete<FIX::Acceptor>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_FIX::Acceptor_*,_std::default_delete<FIX::Acceptor>_>.
                       super__Head_base<0UL,_FIX::Acceptor_*,_false>._M_head_impl + 7));
    FIX::FileStoreFactory::FileStoreFactory((FileStoreFactory *)&local_218,&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&pAcceptor._M_t.
                       super___uniq_ptr_impl<FIX::Acceptor,_std::default_delete<FIX::Acceptor>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_FIX::Acceptor_*,_std::default_delete<FIX::Acceptor>_>.
                       super__Head_base<0UL,_FIX::Acceptor_*,_false>._M_head_impl + 7));
    std::unique_ptr<FIX::Acceptor,std::default_delete<FIX::Acceptor>>::
    unique_ptr<std::default_delete<FIX::Acceptor>,void>
              ((unique_ptr<FIX::Acceptor,std::default_delete<FIX::Acceptor>> *)&e);
    if (iVar1 == 0x74) {
      this = (ThreadedSocketAcceptor *)operator_new(0x228);
      FIX::ThreadedSocketAcceptor::ThreadedSocketAcceptor
                (this,(Application *)local_160,&local_218,
                 (SessionSettings *)
                 &application.m_cracker.m_orderIDs._M_t._M_impl.super__Rb_tree_header._M_node_count)
      ;
      std::unique_ptr<FIX::Acceptor,_std::default_delete<FIX::Acceptor>_>::reset
                ((unique_ptr<FIX::Acceptor,_std::default_delete<FIX::Acceptor>_> *)&e,(pointer)this)
      ;
    }
    else {
      this_00 = (SocketAcceptor *)operator_new(0x1d0);
      FIX::SocketAcceptor::SocketAcceptor
                (this_00,(Application *)local_160,&local_218,
                 (SessionSettings *)
                 &application.m_cracker.m_orderIDs._M_t._M_impl.super__Rb_tree_header._M_node_count)
      ;
      std::unique_ptr<FIX::Acceptor,_std::default_delete<FIX::Acceptor>_>::reset
                ((unique_ptr<FIX::Acceptor,_std::default_delete<FIX::Acceptor>_> *)&e,
                 (pointer)this_00);
    }
    std::unique_ptr<FIX::Acceptor,_std::default_delete<FIX::Acceptor>_>::operator->
              ((unique_ptr<FIX::Acceptor,_std::default_delete<FIX::Acceptor>_> *)&e);
    FIX::Acceptor::start();
    do {
      FIX::process_sleep(1.0);
    } while( true );
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"usage: ");
  poVar2 = std::operator<<(poVar2,*(char **)file.field_2._8_8_);
  poVar2 = std::operator<<(poVar2," -f FILE [-t]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_38);
  return 1;
}

Assistant:

int main(int argc, char **argv) {
  std::string file;
  bool threaded = false;

  if (getopt(argc, argv, "+f:") == 'f') {
    file = optarg;
  } else {
    std::cout << "usage: " << argv[0] << " -f FILE [-t]" << std::endl;
    return 1;
  }

  if (getopt(argc, argv, "+t") == 't') {
    threaded = true;
  }

  try {
    FIX::SessionSettings settings(file);
    Application application;
    FIX::FileStoreFactory factory("store");

    AcceptorPtr pAcceptor;
    if (threaded) {
      pAcceptor.reset(new FIX::ThreadedSocketAcceptor(application, factory, settings));
    } else {
      pAcceptor.reset(new FIX::SocketAcceptor(application, factory, settings));
    }

    pAcceptor->start();
    while (true) {
      FIX::process_sleep(1);
    }
    pAcceptor->stop();
  } catch (std::exception &e) {
    std::cout << e.what();
    return 2;
  }

  return 0;
}